

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

Object * executeStatement(Object *__return_storage_ptr__,Statement s,Environment *env)

{
  ExpressionType EVar1;
  Expression *id;
  Expression *init;
  char *identifer;
  long lVar2;
  Call c;
  Object value;
  Object value_00;
  Object o_00;
  ulong uVar3;
  Object *pOVar4;
  anon_union_8_4_50a03f35_for_Literal_2 aVar5;
  int iVar6;
  char *pcVar7;
  char *ide;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Literal LVar23;
  Block b;
  Object o;
  Object o_1;
  Object o_2;
  undefined8 in_stack_fffffffffffffef8;
  Object local_f8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  Literal LStack_a8;
  int iStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  int iStack_88;
  BlockType BStack_84;
  int local_80;
  BlockType BStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  Literal LStack_68;
  int iStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  int iStack_48;
  BlockType BStack_44;
  int local_40;
  BlockType BStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar8 = s.field_1._0_8_;
  switch(s.type) {
  case STATEMENT_SET:
    uVar9 = 0;
    uVar3 = uVar8 >> 0x20;
    if (s.field_1.blockStatement.blockName == BLOCK_IF || (long)uVar8 < 0) {
      uVar3 = uVar9;
    }
    for (; uVar3 * 0x10 != uVar9; uVar9 = uVar9 + 0x10) {
      id = *(Expression **)((long)&(s.field_1.blockStatement.statements)->type + uVar9);
      init = *(Expression **)((long)&(s.field_1.blockStatement.statements)->field_1 + uVar9);
      EVar1 = id->type;
      if (EVar1 == EXPR_REFERENCE) {
        write_ref(id,init,env,env,s.field_1.blockStatement.numStatements);
      }
      else if (EVar1 == EXPR_ARRAY) {
        write_array(id,init,env,env,s.field_1.blockStatement.numStatements);
      }
      else {
        if (EVar1 != EXPR_VARIABLE) {
          pcVar7 = "\x1b[31m\n[Runtime Error] [Line:%d] Bad assignment target!\x1b[0m";
          goto LAB_00104c5f;
        }
        pcVar7 = (id->field_1).variable.name;
        resolveExpression(&local_f8,init,env);
        value.field_1.instance = local_f8.field_1.instance;
        value.type = local_f8.type;
        value._4_4_ = local_f8._4_4_;
        value.field_1._8_4_ = local_f8.field_1.literal.field_2._0_4_;
        value.field_1._12_4_ = local_f8.field_1.literal.field_2._4_4_;
        value.field_1.routine.arity = (int)local_f8.field_1._16_8_;
        value.field_1._20_4_ = (int)((ulong)local_f8.field_1._16_8_ >> 0x20);
        value.field_1._24_4_ = (int)local_f8.field_1.routine.arguments;
        value.field_1._28_4_ = (int)((ulong)local_f8.field_1._24_8_ >> 0x20);
        value.field_1.container.constructor.numStatements = (int)local_f8.field_1._32_8_;
        value.field_1.container.constructor.blockName =
             (int)((ulong)local_f8.field_1._32_8_ >> 0x20);
        value.field_1.routine.code.numStatements =
             (int)local_f8.field_1.container.constructor.statements;
        value.field_1.routine.code.blockName = (int)((ulong)local_f8.field_1._40_8_ >> 0x20);
        value.field_1._48_4_ = (int)local_f8.field_1.routine.code.statements;
        value.field_1._52_4_ = (int)((ulong)local_f8.field_1._48_8_ >> 0x20);
        env_put(pcVar7,s.field_1.blockStatement.numStatements,value,env);
      }
    }
    goto LAB_00104bde;
  case STATEMENT_ARRAY:
    uVar9 = 0;
    uVar3 = uVar8 >> 0x20;
    if (s.field_1.blockStatement.blockName == BLOCK_IF || (long)uVar8 < 0) {
      uVar3 = uVar9;
    }
    while( true ) {
      if (uVar3 == uVar9) {
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
        (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
        (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
        __return_storage_ptr__->type = OBJECT_NULL;
        *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
        (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
        return __return_storage_ptr__;
      }
      lVar2 = *(long *)(&(s.field_1.blockStatement.statements)->type + uVar9 * 2);
      LVar23 = resolveLiteral(*(Expression **)(lVar2 + 0x10),s.field_1.blockStatement.numStatements,
                              env);
      if ((LVar23._0_8_ & 0xffffffff00000000) != 0x100000000) break;
      env_arr_new(*(char **)(lVar2 + 0x18),s.field_1.blockStatement.numStatements,
                  LVar23.field_2.iVal,env);
      uVar9 = uVar9 + 1;
    }
    pcVar7 = "\x1b[31m\n[Runtime Error] [Line:%d] Array dimension must be an integer!\x1b[0m";
LAB_00104c5f:
    uVar8 = uVar8 & 0xffffffff;
    goto LAB_00104c62;
  case STATEMENT_INPUT:
    uVar9 = 0;
    uVar3 = uVar8 >> 0x20;
    if (s.field_1.blockStatement.blockName == BLOCK_IF || (long)uVar8 < 0) {
      uVar3 = uVar9;
    }
    for (; uVar3 * 0x18 - uVar9 != 0; uVar9 = uVar9 + 0x18) {
      iVar6 = *(int *)((long)&(s.field_1.blockStatement.statements)->type + uVar9);
      pcVar7 = *(char **)((long)&(s.field_1.blockStatement.statements)->field_1 + uVar9);
      if (iVar6 == 1) {
        identifer = *(char **)((long)&(s.field_1.blockStatement.statements)->field_1 + uVar9 + 8);
        iVar6 = (int)pcVar7;
        if (iVar6 == 2) {
          LStack_68 = getFloat(s.field_1.blockStatement.numStatements);
          local_70 = 1;
          uVar8 = CONCAT44(uStack_6c,1);
          uVar11 = LStack_68.field_2._0_4_;
          uVar12 = LStack_68.field_2._4_4_;
          uVar13 = iStack_58;
          uVar14 = uStack_54;
          uVar15 = local_50;
          uVar16 = uStack_4c;
          uVar17 = iStack_48;
          uVar18 = BStack_44;
          uVar19 = local_40;
          uVar20 = BStack_3c;
          uVar21 = uStack_38;
          uVar22 = uStack_34;
          uVar10 = LStack_68._0_8_;
        }
        else if (iVar6 == 1) {
          LStack_a8 = getInt(s.field_1.blockStatement.numStatements);
          local_b0 = 1;
          uVar8 = CONCAT44(uStack_ac,1);
          uVar11 = LStack_a8.field_2._0_4_;
          uVar12 = LStack_a8.field_2._4_4_;
          uVar13 = iStack_98;
          uVar14 = uStack_94;
          uVar15 = local_90;
          uVar16 = uStack_8c;
          uVar17 = iStack_88;
          uVar18 = BStack_84;
          uVar19 = local_80;
          uVar20 = BStack_7c;
          uVar21 = uStack_78;
          uVar22 = uStack_74;
          uVar10 = LStack_a8._0_8_;
        }
        else {
          if (iVar6 != 0) goto LAB_0010492d;
          local_f8.field_1.literal = getString(s.field_1.blockStatement.numStatements);
          local_f8.type = 1;
          uVar11 = local_f8.field_1._8_4_;
          uVar12 = local_f8.field_1._12_4_;
          uVar13 = local_f8.field_1.routine.arity;
          uVar14 = local_f8.field_1._20_4_;
          uVar15 = local_f8.field_1._24_4_;
          uVar16 = local_f8.field_1._28_4_;
          uVar17 = local_f8.field_1.container.constructor.numStatements;
          uVar18 = local_f8.field_1.container.constructor.blockName;
          uVar19 = local_f8.field_1.routine.code.numStatements;
          uVar20 = local_f8.field_1.routine.code.blockName;
          uVar21 = local_f8.field_1._48_4_;
          uVar22 = local_f8.field_1._52_4_;
          uVar8 = local_f8._0_8_;
          uVar10 = local_f8.field_1.instance;
        }
        value_00.field_1.instance = (Instance *)uVar10;
        value_00._0_8_ = uVar8;
        value_00.field_1._8_4_ = uVar11;
        value_00.field_1._12_4_ = uVar12;
        value_00.field_1.routine.arity = uVar13;
        value_00.field_1._20_4_ = uVar14;
        value_00.field_1._24_4_ = uVar15;
        value_00.field_1._28_4_ = uVar16;
        value_00.field_1.container.constructor.numStatements = uVar17;
        value_00.field_1.container.constructor.blockName = uVar18;
        value_00.field_1.routine.code.numStatements = uVar19;
        value_00.field_1.routine.code.blockName = uVar20;
        value_00.field_1._48_4_ = uVar21;
        value_00.field_1._52_4_ = uVar22;
        env_put(identifer,s.field_1.blockStatement.numStatements,value_00,env);
      }
      else if (iVar6 == 0) {
        printString(pcVar7);
      }
LAB_0010492d:
    }
    goto LAB_00104bde;
  case STATEMENT_IF:
    LVar23 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements,
                            env);
    if (LVar23.type == LIT_LOGICAL) {
      if (LVar23.field_2._0_4_ != 0) {
        s.field_1.ifStatement.elseBranch.statements = s.field_1.ifStatement.thenBranch.statements;
        s.field_1._32_8_ = s.field_1.breakStatement.pos.file;
      }
      b.statements = s.field_1.ifStatement.elseBranch.statements;
      b._0_8_ = s.field_1._32_8_;
      executeBlock(__return_storage_ptr__,b,env);
      return __return_storage_ptr__;
    }
    goto LAB_00104c6e;
  case STATEMENT_WHILE:
    LVar23 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements,
                            env);
    aVar5 = LVar23.field_2;
    if (LVar23.type == LIT_LOGICAL) {
      local_f8.field_1.container.constructor.statements = (Statement *)0;
      local_f8.field_1.routine.code.statements = (Statement *)0;
      local_f8.field_1.routine.arguments = (char **)0;
      local_f8.field_1._32_8_ = 0;
      local_f8.field_1._16_8_ = 0;
      local_f8.type = OBJECT_NULL;
      local_f8._4_4_ = 0;
      local_f8.field_1.literal = (Literal)ZEXT816((ulong)0x400000000);
      while (aVar5.lVal != 0) {
        executeBlock(&local_f8,s.field_1._16_16_,env);
        if (brk == '\x01') {
          brk = '\0';
          break;
        }
        if (ret == '\x01') {
          *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) =
               local_f8.field_1.container.constructor.statements;
          *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) =
               local_f8.field_1.routine.code.statements;
          (__return_storage_ptr__->field_1).routine.arguments = local_f8.field_1.routine.arguments;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_f8.field_1._32_8_;
          (__return_storage_ptr__->field_1).literal.field_2.iVal =
               (long)local_f8.field_1.literal.field_2;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_f8.field_1._16_8_;
          goto LAB_00104c05;
        }
        LVar23 = resolveLiteral(s.field_1.ifStatement.condition,
                                s.field_1.blockStatement.numStatements,env);
        aVar5 = LVar23.field_2;
      }
      break;
    }
LAB_00104c6e:
    pcVar7 = "\x1b[31m\n[Runtime Error] [Line:%d] Not a logical expression as condition!\x1b[0m";
    uVar8 = (ulong)s.field_1.breakStatement.pos.type;
LAB_00104c62:
    printf(pcVar7,uVar8);
    stop();
  case STATEMENT_BREAK:
    brk = '\x01';
    break;
  case STATEMENT_PRINT:
    if (s.field_1.printStatement.argCount < 1) {
      s.field_1.blockStatement.blockName = BLOCK_IF;
    }
    for (uVar8 = 0; s.field_1.blockStatement.blockName != uVar8; uVar8 = uVar8 + 1) {
      resolveExpression(&local_f8,
                        *(Expression **)(&(s.field_1.blockStatement.statements)->type + uVar8 * 2),
                        env);
      aVar5 = local_f8.field_1.literal.field_2;
      switch(local_f8._0_8_ & 0xffffffff) {
      case 0:
        printf("Null",local_f8.field_1.arr.values);
        break;
      case 1:
        if (local_f8.field_1.literal.type < (LIT_NULL|LIT_INT)) {
          pOVar4 = (Object *)
                   (*(code *)(&DAT_00108be8 +
                             *(int *)(&DAT_00108be8 + ((ulong)local_f8.field_1.instance >> 0x20) * 4
                                     )))();
          return pOVar4;
        }
        break;
      case 2:
        printf("<array of %d>",(ulong)local_f8.field_1.instance & 0xffffffff);
        break;
      case 3:
        pcVar7 = "<routine %s>";
        goto LAB_00104a79;
      case 4:
        pcVar7 = "<container %s>";
        goto LAB_00104a79;
      case 5:
        pcVar7 = "<instance of container %s>";
        aVar5.sVal = (local_f8.field_1.instance)->name;
LAB_00104a79:
        printf(pcVar7,aVar5.iVal);
      }
    }
    goto LAB_00104bde;
  case STATEMENT_ROUTINE:
    env_routine_put(s.field_1.routine,s.field_1.blockStatement.numStatements,globalEnv);
    break;
  case STATEMENT_CALL:
    if ((s.field_1.blockStatement.statements)->type != STATEMENT_BREAK) {
      pcVar7 = "\x1b[31m\n[Runtime Error] [Line:%d] Expected call expression!\x1b[0m";
      uVar8 = (ulong)s.field_1.breakStatement.pos.type;
      goto LAB_00104c62;
    }
    uVar10 = *(undefined8 *)((long)&(s.field_1.blockStatement.statements)->field_1 + 0x18);
    c._20_4_ = (int)((ulong)*(undefined8 *)
                             ((long)&(s.field_1.blockStatement.statements)->field_1 + 0x10) >> 0x20)
    ;
    c._0_20_ = *(undefined1 (*) [20])&(s.field_1.blockStatement.statements)->field_1;
    c.arguments._0_4_ = (int)uVar10;
    c.arguments._4_4_ = (int)((ulong)uVar10 >> 0x20);
    resolveCall(&local_f8,c,env);
    if ((local_f8.type != OBJECT_NULL) &&
       (printf("\x1b[33m\n[Warning] [Line %d] Ignoring return value!\x1b[0m",
               (ulong)s.field_1.breakStatement.pos.type), local_f8.type == OBJECT_INSTANCE)) {
      o_00.field_1._8_4_ = (int)local_f8.field_1._16_8_;
      o_00._0_16_ = local_f8.field_1.literal;
      o_00.field_1._12_4_ = (int)((ulong)local_f8.field_1._16_8_ >> 0x20);
      o_00.field_1.routine.arity = (int)local_f8.field_1.routine.arguments;
      o_00.field_1._20_4_ = (int)((ulong)local_f8.field_1._24_8_ >> 0x20);
      o_00.field_1._24_4_ = (int)local_f8.field_1._32_8_;
      o_00.field_1._28_4_ = (int)((ulong)local_f8.field_1._32_8_ >> 0x20);
      o_00.field_1.container.constructor.numStatements =
           (int)local_f8.field_1.container.constructor.statements;
      o_00.field_1.container.constructor.blockName = (int)((ulong)local_f8.field_1._40_8_ >> 0x20);
      o_00.field_1.routine.code.numStatements = (int)local_f8.field_1.routine.code.statements;
      o_00.field_1.routine.code.blockName = (int)((ulong)local_f8.field_1._48_8_ >> 0x20);
      o_00.field_1.routine.code.statements = (Statement *)in_stack_fffffffffffffef8;
      gc_obj(o_00);
    }
    break;
  case STATEMENT_RETURN:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    if ((s.field_1.blockStatement.statements != (Statement *)0x0) &&
       (resolveExpression(__return_storage_ptr__,s.field_1.ifStatement.condition,env),
       __return_storage_ptr__->type == OBJECT_INSTANCE)) {
      ((__return_storage_ptr__->field_1).instance)->fromReturn = 1;
    }
    ret = 1;
    return __return_storage_ptr__;
  case STATEMENT_CONTAINER:
    env_container_put(s.field_1._0_48_,s.field_1.blockStatement.numStatements,globalEnv);
    break;
  case STATEMENT_END:
    exit(0);
  }
LAB_00104bde:
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  local_f8.type = OBJECT_NULL;
  local_f8._4_4_ = 0;
  local_f8.field_1.instance = (Instance *)0x400000000;
LAB_00104c05:
  __return_storage_ptr__->type = local_f8.type;
  *(int *)&__return_storage_ptr__->field_0x4 = local_f8._4_4_;
  (__return_storage_ptr__->field_1).instance = local_f8.field_1.instance;
  return __return_storage_ptr__;
}

Assistant:

static Object executeStatement(Statement s, Environment *env){
    switch(s.type){
        case STATEMENT_PRINT:
            return executePrint(s.printStatement, env);
        case STATEMENT_IF:
            return executeIf(s.ifStatement, env);
        case STATEMENT_WHILE:
            return executeWhile(s.whileStatement, env);
        case STATEMENT_SET:
            return executeSet(s.setStatement, env);
        case STATEMENT_ARRAY:
            return executeArray(s.arrayStatement, env);
        case STATEMENT_INPUT:
            return executeInput(s.inputStatement, env);
        case STATEMENT_BREAK:
            return executeBreak();
        case STATEMENT_END:
            return executeEnd();
        case STATEMENT_BEGIN:
            return executeBegin();
            //       case STATEMENT_DO:
            //           executeDo(s.)
        case STATEMENT_ROUTINE:
            return registerRoutine(s.routine);
        case STATEMENT_CONTAINER:
            return registerContainer(s.container);
        case STATEMENT_CALL:
            return executeCall(s.callStatement, env);
        case STATEMENT_NOOP:
            break;
        case STATEMENT_RETURN:
            return executeReturn(s.returnStatement, env);
        default:
            break;
    }
    return nullObject;
}